

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

bool __thiscall google::protobuf::MapKey::operator==(MapKey *this,MapKey *other)

{
  CppType CVar1;
  LogMessage *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  LogMessageFatal local_70 [23];
  Voidify local_59;
  LogMessageFatal local_58 [19];
  Voidify local_45 [13];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  MapKey *local_20;
  MapKey *other_local;
  MapKey *this_local;
  
  local_20 = other;
  other_local = this;
  if (this->type_ == other->type_) {
    CVar1 = type(this);
    switch(CVar1) {
    case CPPTYPE_INT32:
      this_local._7_1_ = (this->val_).int32_value == (local_20->val_).int32_value;
      break;
    case CPPTYPE_INT64:
      this_local._7_1_ = (this->val_).int64_value == (local_20->val_).int64_value;
      break;
    case CPPTYPE_UINT32:
      this_local._7_1_ = (this->val_).int32_value == (local_20->val_).int32_value;
      break;
    case CPPTYPE_UINT64:
      this_local._7_1_ = (this->val_).int64_value == (local_20->val_).int64_value;
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.h"
                 ,0xb8);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [12])"Unsupported");
      absl::lts_20240722::log_internal::Voidify::operator&&(local_45,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
    case CPPTYPE_BOOL:
      this_local._7_1_ = ((this->val_).bool_value & 1U) == ((local_20->val_).bool_value & 1U);
      break;
    case CPPTYPE_STRING:
      __lhs = internal::
              ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
              ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                     *)this);
      __rhs = internal::
              ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
              ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                     *)local_20);
      this_local._7_1_ = std::operator==(__lhs,__rhs);
      break;
    default:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.h"
                 ,199);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_70);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [16])"Can\'t get here.");
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_59,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
    }
    return this_local._7_1_;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.h"
             ,0xb1);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [27])"Unsupported: type mismatch");
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

bool operator==(const MapKey& other) const {
    if (type_ != other.type_) {
      // To be consistent with operator<, we don't allow this either.
      ABSL_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        ABSL_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        return val_.string_value.get() == other.val_.string_value.get();
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value == other.val_.int64_value;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value == other.val_.int32_value;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value == other.val_.uint64_value;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value == other.val_.uint32_value;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value == other.val_.bool_value;
    }
    ABSL_LOG(FATAL) << "Can't get here.";
    return false;
  }